

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-cardinalities.cc
# Opt level: O1

Cardinality __thiscall testing::Between(testing *this,int min,int max)

{
  int iVar1;
  undefined8 *puVar2;
  ostream *poVar3;
  FailureReporterInterface *pFVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _func_int **pp_Var7;
  Cardinality CVar8;
  stringstream ss;
  long *local_1d0 [2];
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  puVar2 = (undefined8 *)operator_new(0x10);
  *puVar2 = &PTR__CardinalityInterface_0025b4f0;
  iVar1 = 0;
  if (0 < min) {
    iVar1 = min;
  }
  *(int *)(puVar2 + 1) = iVar1;
  if (iVar1 <= max) {
    iVar1 = max;
  }
  *(int *)((long)puVar2 + 0xc) = iVar1;
  std::__cxx11::stringstream::stringstream(local_1b0);
  if (min < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"The invocation lower bound must be >= 0, ",0x29);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"but is actually ",0x10);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
    std::__cxx11::stringbuf::str();
    pFVar4 = internal::GetFailureReporter();
    pp_Var7 = pFVar4->_vptr_FailureReporterInterface;
    uVar6 = 0x3a;
  }
  else if (max < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"The invocation upper bound must be >= 0, ",0x29);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"but is actually ",0x10);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,max);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
    std::__cxx11::stringbuf::str();
    pFVar4 = internal::GetFailureReporter();
    pp_Var7 = pFVar4->_vptr_FailureReporterInterface;
    uVar6 = 0x3e;
  }
  else {
    if (min <= max) goto LAB_001e4405;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"The invocation upper bound (",0x1c);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,max);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,") must be >= the invocation lower bound (",0x29);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,").",2);
    std::__cxx11::stringbuf::str();
    pFVar4 = internal::GetFailureReporter();
    pp_Var7 = pFVar4->_vptr_FailureReporterInterface;
    uVar6 = 0x43;
  }
  (*pp_Var7[2])(pFVar4,0,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googlemock/src/gmock-cardinalities.cc"
                ,uVar6,local_1d0);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
LAB_001e4405:
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  *(undefined8 **)this = puVar2;
  *(undefined8 *)(this + 8) = 0;
  puVar5 = (undefined8 *)operator_new(0x18);
  puVar5[1] = 0x100000001;
  *puVar5 = &PTR___Sp_counted_base_0025b538;
  puVar5[2] = puVar2;
  *(undefined8 **)(this + 8) = puVar5;
  CVar8.impl_.super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  CVar8.impl_.super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Cardinality)
         CVar8.impl_.
         super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

GTEST_API_ Cardinality Between(int min, int max) {
  return Cardinality(new BetweenCardinalityImpl(min, max));
}